

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O3

int __thiscall
cmCPackArchiveGenerator::PackageComponents(cmCPackArchiveGenerator *this,bool ignoreGroup)

{
  size_type *psVar1;
  archive *paVar2;
  pointer pcVar3;
  cmCPackLog *pcVar4;
  _Base_ptr p_Var5;
  _Alloc_hider msg;
  undefined8 uVar6;
  size_type sVar7;
  int iVar8;
  char *pcVar9;
  long *plVar10;
  ostream *poVar11;
  size_t sVar12;
  _Base_ptr p_Var13;
  undefined8 *puVar14;
  ulong *puVar15;
  undefined7 in_register_00000031;
  archive *paVar16;
  ulong *puVar17;
  _Base_ptr p_Var18;
  string packageFileName;
  string localToplevel;
  cmArchiveWrite archive;
  ostringstream cmCPackLog_msg;
  cmGeneratedFileStream gf;
  string local_548;
  string local_528;
  long *local_508;
  long local_500;
  long local_4f8 [2];
  string *local_4e8;
  _Rb_tree_node_base *local_4e0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_4d8;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [56];
  size_type local_488;
  undefined1 local_3f0 [112];
  ios_base local_380 [264];
  undefined1 local_278 [112];
  ios_base local_208 [472];
  
  local_4d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4d8,
                    (this->super_cmCPackGenerator).packageFileNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if ((int)CONCAT71(in_register_00000031,ignoreGroup) == 0) {
    p_Var13 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
              _M_header._M_left;
    local_4e0 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    if (p_Var13 != local_4e0) {
      puVar17 = (ulong *)(local_278 + 0x10);
      local_4e8 = &this->ArchiveFormat;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"Packaging component group: ",0x1b);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,*(char **)(p_Var13 + 1),(long)p_Var13[1]._M_parent
                            );
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pcVar4 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        uVar6 = local_3f0._0_8_;
        sVar12 = strlen((char *)local_3f0._0_8_);
        cmCPackLog::Log(pcVar4,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x83,(char *)uVar6,sVar12);
        if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
          operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::ios_base::~ios_base(local_208);
        local_3f0._0_8_ = local_3f0 + 0x10;
        pcVar3 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3f0,pcVar3,
                   pcVar3 + (this->super_cmCPackGenerator).toplevel._M_string_length);
        plVar10 = (long *)std::__cxx11::string::append((char *)local_3f0);
        puVar15 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar15) {
          local_278._16_8_ = *puVar15;
          local_278._24_8_ = plVar10[3];
          local_278._0_8_ = puVar17;
        }
        else {
          local_278._16_8_ = *puVar15;
          local_278._0_8_ = (ulong *)*plVar10;
        }
        local_278._8_8_ = plVar10[1];
        *plVar10 = (long)puVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        GetArchiveComponentFileName((string *)local_4d0,this,(string *)(p_Var13 + 1),true);
        paVar16 = (archive *)0xf;
        if ((ulong *)local_278._0_8_ != puVar17) {
          paVar16 = (archive *)local_278._16_8_;
        }
        paVar2 = (archive *)((long)(uint *)local_4d0._8_8_ + local_278._8_8_);
        if (paVar16 < paVar2) {
          paVar16 = (archive *)0xf;
          if ((ostream *)local_4d0._0_8_ != (ostream *)local_4c0) {
            paVar16 = (archive *)local_4c0._0_8_;
          }
          if (paVar16 < paVar2) goto LAB_0017ad4e;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_4d0,0,(char *)0x0,local_278._0_8_);
        }
        else {
LAB_0017ad4e:
          puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_278,local_4d0._0_8_)
          ;
        }
        psVar1 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_528.field_2._M_allocated_capacity = *psVar1;
          local_528.field_2._8_8_ = puVar14[3];
          local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
        }
        else {
          local_528.field_2._M_allocated_capacity = *psVar1;
          local_528._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_528._M_string_length = puVar14[1];
        *puVar14 = psVar1;
        puVar14[1] = 0;
        *(undefined1 *)psVar1 = 0;
        if ((ostream *)local_4d0._0_8_ != (ostream *)local_4c0) {
          operator_delete((void *)local_4d0._0_8_,(ulong)(local_4c0._0_8_ + 1));
        }
        if ((ulong *)local_278._0_8_ != puVar17) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
          operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
        }
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,None);
        cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_278,&local_528,false,true);
        iVar8 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])
                          (this,(ostringstream *)local_278);
        if (iVar8 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3f0,"Problem to generate Header for archive <",0x28);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f0,local_528._M_dataplus._M_p,
                               local_528._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,">.",2);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar4 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          uVar6 = local_4d0._0_8_;
          sVar12 = strlen((char *)local_4d0._0_8_);
          cmCPackLog::Log(pcVar4,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x8b,(char *)uVar6,sVar12);
          if ((ostream *)local_4d0._0_8_ != (ostream *)local_4c0) {
            operator_delete((void *)local_4d0._0_8_,(ulong)(local_4c0._0_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
          std::ios_base::~ios_base(local_380);
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
LAB_0017b75c:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_528._M_dataplus._M_p == &local_528.field_2) {
            return 0;
          }
          goto LAB_0017b8a7;
        }
        cmArchiveWrite::cmArchiveWrite
                  ((cmArchiveWrite *)local_4d0,(ostream *)local_278,this->Compress,local_4e8);
        sVar7 = local_488;
        if (local_488 == 0) {
          p_Var5 = p_Var13[5]._M_left;
          for (p_Var18 = p_Var13[5]._M_parent; p_Var18 != p_Var5;
              p_Var18 = (_Base_ptr)&p_Var18->_M_parent) {
            addOneComponentToArchive(this,(cmArchiveWrite *)local_4d0,*(cmCPackComponent **)p_Var18)
            ;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3f0,"Problem to create archive <",0x1b);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f0,local_528._M_dataplus._M_p,
                               local_528._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,">, ERROR = ",0xb);
          local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_548,local_4c0._48_8_,(pointer)(local_4c0._48_8_ + local_488));
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_548._M_dataplus._M_p,local_548._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
            operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
          }
          pcVar4 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          msg._M_p = local_548._M_dataplus._M_p;
          sVar12 = strlen(local_548._M_dataplus._M_p);
          cmCPackLog::Log(pcVar4,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x8b,msg._M_p,sVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
            operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
          std::ios_base::~ios_base(local_380);
        }
        cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_4d0);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
        if (sVar7 != 0) goto LAB_0017b75c;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_4d8,&local_528);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != local_4e0);
    }
    p_Var13 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_left;
    local_4e0 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    if (p_Var13 != local_4e0) {
      local_4e8 = &this->ArchiveFormat;
      do {
        if (*(long *)(p_Var13 + 4) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Component <",0xb)
          ;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_278,*(char **)(p_Var13 + 2),
                               (long)p_Var13[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"> does not belong to any group, package it separately.",0x36);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar4 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          uVar6 = local_3f0._0_8_;
          sVar12 = strlen((char *)local_3f0._0_8_);
          cmCPackLog::Log(pcVar4,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x9e,(char *)uVar6,sVar12);
          puVar17 = (ulong *)(local_278 + 0x10);
          if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
            operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
          std::ios_base::~ios_base(local_208);
          local_278._0_8_ = puVar17;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_278,"CPACK_TEMPORARY_DIRECTORY","");
          pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_278);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_528,pcVar9,(allocator<char> *)local_3f0);
          if ((ulong *)local_278._0_8_ != puVar17) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
          pcVar3 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_548,pcVar3,
                     pcVar3 + (this->super_cmCPackGenerator).toplevel._M_string_length);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278,"/",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var13 + 1));
          std::__cxx11::string::_M_append((char *)&local_528,local_278._0_8_);
          if ((ulong *)local_278._0_8_ != puVar17) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          GetArchiveComponentFileName((string *)local_3f0,this,(string *)(p_Var13 + 1),false);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x533aad);
          puVar15 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar15) {
            local_278._16_8_ = *puVar15;
            local_278._24_8_ = plVar10[3];
            local_278._0_8_ = puVar17;
          }
          else {
            local_278._16_8_ = *puVar15;
            local_278._0_8_ = (ulong *)*plVar10;
          }
          local_278._8_8_ = plVar10[1];
          *plVar10 = (long)puVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_548,local_278._0_8_);
          if ((ulong *)local_278._0_8_ != puVar17) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
            operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
          }
          cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,None);
          cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_278,&local_548,false,true);
          iVar8 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])
                            (this,(cmGeneratedFileStream *)local_278);
          if (iVar8 == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3f0,"Problem to generate Header for archive <",0x28);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f0,local_548._M_dataplus._M_p,
                                 local_548._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,">.",2);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            pcVar4 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            uVar6 = local_4d0._0_8_;
            sVar12 = strlen((char *)local_4d0._0_8_);
            cmCPackLog::Log(pcVar4,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0xa8,(char *)uVar6,sVar12);
            goto LAB_0017b82e;
          }
          cmArchiveWrite::cmArchiveWrite
                    ((cmArchiveWrite *)local_4d0,(ostream *)local_278,this->Compress,local_4e8);
          sVar7 = local_488;
          if (local_488 == 0) {
            addOneComponentToArchive
                      (this,(cmArchiveWrite *)local_4d0,(cmCPackComponent *)(p_Var13 + 2));
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3f0,"Problem to create archive <",0x1b);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f0,local_548._M_dataplus._M_p,
                                 local_548._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,">, ERROR = ",0xb);
            local_508 = local_4f8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_508,local_4c0._48_8_,(pointer)(local_4c0._48_8_ + local_488)
                      );
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)local_508,local_500);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            if (local_508 != local_4f8) {
              operator_delete(local_508,local_4f8[0] + 1);
            }
            pcVar4 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            plVar10 = local_508;
            sVar12 = strlen((char *)local_508);
            cmCPackLog::Log(pcVar4,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0xa8,(char *)plVar10,sVar12);
            if (local_508 != local_4f8) {
              operator_delete(local_508,local_4f8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
            std::ios_base::~ios_base(local_380);
          }
          cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_4d0);
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
          if (sVar7 != 0) goto LAB_0017b87d;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_4d8,&local_548);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
            operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_528._M_dataplus._M_p != &local_528.field_2) {
            operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != local_4e0);
    }
  }
  else {
    p_Var13 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_left;
    local_4e0 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                 _M_header;
    if (p_Var13 != local_4e0) {
      local_4e8 = &this->ArchiveFormat;
      do {
        puVar17 = (ulong *)(local_278 + 0x10);
        local_278._0_8_ = puVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_278,"CPACK_TEMPORARY_DIRECTORY","");
        pcVar9 = cmCPackGenerator::GetOption
                           (&this->super_cmCPackGenerator,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_278);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_528,pcVar9,(allocator<char> *)local_3f0);
        if ((ulong *)local_278._0_8_ != puVar17) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
        pcVar3 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_548,pcVar3,
                   pcVar3 + (this->super_cmCPackGenerator).toplevel._M_string_length);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var13 + 1));
        std::__cxx11::string::_M_append((char *)&local_528,local_278._0_8_);
        if ((ulong *)local_278._0_8_ != puVar17) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        GetArchiveComponentFileName((string *)local_3f0,this,(string *)(p_Var13 + 1),false);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x533aad);
        puVar15 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar15) {
          local_278._16_8_ = *puVar15;
          local_278._24_8_ = plVar10[3];
          local_278._0_8_ = puVar17;
        }
        else {
          local_278._16_8_ = *puVar15;
          local_278._0_8_ = (ulong *)*plVar10;
        }
        local_278._8_8_ = plVar10[1];
        *plVar10 = (long)puVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_548,local_278._0_8_);
        if ((ulong *)local_278._0_8_ != puVar17) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
          operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
        }
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,None);
        cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_278,&local_548,false,true);
        iVar8 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])
                          (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_278);
        if (iVar8 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3f0,"Problem to generate Header for archive <",0x28);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f0,local_548._M_dataplus._M_p,
                               local_548._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,">.",2);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar4 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          uVar6 = local_4d0._0_8_;
          sVar12 = strlen((char *)local_4d0._0_8_);
          cmCPackLog::Log(pcVar4,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0xbd,(char *)uVar6,sVar12);
LAB_0017b82e:
          if ((ostream *)local_4d0._0_8_ != (ostream *)local_4c0) {
            operator_delete((void *)local_4d0._0_8_,(ulong)(local_4c0._0_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
          std::ios_base::~ios_base(local_380);
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
LAB_0017b87d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
            operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_528._M_dataplus._M_p != &local_528.field_2) {
LAB_0017b8a7:
            operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
          }
          return 0;
        }
        cmArchiveWrite::cmArchiveWrite
                  ((cmArchiveWrite *)local_4d0,(ostream *)local_278,this->Compress,local_4e8);
        sVar7 = local_488;
        if (local_488 == 0) {
          addOneComponentToArchive
                    (this,(cmArchiveWrite *)local_4d0,(cmCPackComponent *)(p_Var13 + 2));
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3f0,"Problem to create archive <",0x1b);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f0,local_548._M_dataplus._M_p,
                               local_548._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,">, ERROR = ",0xb);
          local_508 = local_4f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_508,local_4c0._48_8_,(pointer)(local_4c0._48_8_ + local_488));
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)local_508,local_500);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          if (local_508 != local_4f8) {
            operator_delete(local_508,local_4f8[0] + 1);
          }
          pcVar4 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          plVar10 = local_508;
          sVar12 = strlen((char *)local_508);
          cmCPackLog::Log(pcVar4,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0xbd,(char *)plVar10,sVar12);
          if (local_508 != local_4f8) {
            operator_delete(local_508,local_4f8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
          std::ios_base::~ios_base(local_380);
        }
        cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_4d0);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
        if (sVar7 != 0) goto LAB_0017b87d;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_4d8,&local_548);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != local_4e0);
    }
  }
  return 1;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponents(bool ignoreGroup)
{
  packageFileNames.clear();
  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup) {
    for (auto const& compG : this->ComponentGroups) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Packaging component group: " << compG.first << std::endl);
      // Begin the archive for this group
      std::string packageFileName = std::string(toplevel) + "/" +
        this->GetArchiveComponentFileName(compG.first, true);

      // open a block in order to automatically close archive
      // at the end of the block
      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // now iterate over the component of this group
        for (cmCPackComponent* comp : (compG.second).Components) {
          // Add the files of this component to the archive
          addOneComponentToArchive(archive, comp);
        }
      }
      // add the generated package to package file names list
      packageFileNames.push_back(std::move(packageFileName));
    }
    // Handle Orphan components (components not belonging to any groups)
    for (auto& comp : this->Components) {
      // Does the component belong to a group?
      if (comp.second.Group == nullptr) {
        cmCPackLogger(
          cmCPackLog::LOG_VERBOSE,
          "Component <"
            << comp.second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        std::string localToplevel(
          this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
        std::string packageFileName = std::string(toplevel);

        localToplevel += "/" + comp.first;
        packageFileName +=
          "/" + this->GetArchiveComponentFileName(comp.first, false);

        {
          DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
          // Add the files of this component to the archive
          addOneComponentToArchive(archive, &(comp.second));
        }
        // add the generated package to package file names list
        packageFileNames.push_back(std::move(packageFileName));
      }
    }
  }
  // CPACK_COMPONENTS_IGNORE_GROUPS is set
  // We build 1 package per component
  else {
    for (auto& comp : this->Components) {
      std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
      std::string packageFileName = std::string(toplevel);

      localToplevel += "/" + comp.first;
      packageFileName +=
        "/" + this->GetArchiveComponentFileName(comp.first, false);

      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // Add the files of this component to the archive
        addOneComponentToArchive(archive, &(comp.second));
      }
      // add the generated package to package file names list
      packageFileNames.push_back(std::move(packageFileName));
    }
  }
  return 1;
}